

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack8to1.h
# Opt level: O2

void ncnn::im2col_sgemm_pack8to1_avx
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  float *pfVar1;
  undefined4 uVar2;
  uint uVar3;
  int iVar4;
  void *pvVar5;
  size_t sVar6;
  void *pvVar7;
  size_t sVar8;
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  int *piVar12;
  int iVar13;
  _func_int ***ppp_Var14;
  undefined1 (*pauVar15) [32];
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  int iVar19;
  int iVar20;
  ulong uVar21;
  long lVar22;
  undefined1 (*pauVar23) [32];
  undefined1 (*pauVar24) [32];
  ulong uVar25;
  float *pfVar26;
  undefined1 (*pauVar27) [32];
  int q;
  ulong uVar28;
  undefined1 (*pauVar29) [32];
  undefined1 (*pauVar30) [32];
  undefined1 (*pauVar31) [32];
  ulong uVar32;
  long lVar33;
  undefined1 (*pauVar34) [32];
  uint uVar35;
  uint uVar36;
  bool bVar37;
  undefined1 auVar38 [16];
  float fVar39;
  float fVar48;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar46;
  float fVar47;
  float fVar49;
  float fVar50;
  float fVar51;
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  float fVar52;
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 (*local_f0) [32];
  undefined1 local_c8 [64];
  size_t local_88;
  void *local_78;
  ulong local_70;
  Mat *local_68;
  ulong local_60;
  float zeros [8];
  
  uVar3 = bottom_im2col->w;
  uVar21 = (ulong)(int)uVar3;
  iVar13 = bottom_im2col->h;
  uVar36 = bottom_im2col->c;
  iVar4 = top_blob->c;
  pvVar5 = _bias->data;
  local_88 = 0;
  local_c8._0_8_ = (Allocator *)0x0;
  local_c8._8_4_ = 0;
  local_c8._12_4_ = 0;
  local_c8._16_8_ = SUB168(ZEXT816(0) << 0x40,4);
  local_c8._24_4_ = 0;
  iVar20 = iVar13 * 8;
  if ((long)uVar21 < 8) {
    iVar20 = iVar13;
  }
  local_c8._48_12_ = SUB1612(ZEXT816(0) << 0x40,4);
  uVar35 = (uVar3 & 7) + (uVar3 >> 3);
  if ((long)uVar21 < 8) {
    uVar35 = uVar3;
  }
  local_c8._32_8_ = local_c8._0_8_;
  local_c8._40_4_ = local_c8._8_4_;
  local_c8._44_4_ = local_c8._12_4_;
  Mat::create((Mat *)local_c8,iVar20,uVar36,uVar35,0x20,8,opt->workspace_allocator);
  uVar16 = 0;
  iVar20 = 0;
  if (0 < iVar13) {
    iVar20 = iVar13;
  }
  uVar25 = 0;
  if (0 < (int)uVar36) {
    uVar25 = (ulong)uVar36;
  }
  uVar18 = (ulong)(uint)((int)uVar3 >> 3);
  if ((int)uVar3 >> 3 < 1) {
    uVar18 = uVar16;
  }
  lVar22 = (long)(int)(uVar3 * 8) * 4;
  lVar17 = 0x80;
  for (; uVar16 != uVar18; uVar16 = uVar16 + 1) {
    ppp_Var14 = (_func_int ***)
                ((long)(_func_int ***)local_c8._0_8_ + local_88 * uVar16 * local_c8._16_8_);
    for (uVar28 = 0; uVar28 != uVar25; uVar28 = uVar28 + 1) {
      pauVar30 = (undefined1 (*) [32])
                 ((long)bottom_im2col->data +
                 bottom_im2col->cstep * bottom_im2col->elemsize * uVar28 + lVar17);
      iVar19 = iVar20;
      while (bVar37 = iVar19 != 0, iVar19 = iVar19 + -1, bVar37) {
        auVar42 = vunpcklps_avx(pauVar30[-4],pauVar30[-3]);
        auVar53 = vunpckhps_avx(pauVar30[-4],pauVar30[-3]);
        auVar65 = vunpcklps_avx(pauVar30[-2],pauVar30[-1]);
        auVar56 = vunpckhps_avx(pauVar30[-2],pauVar30[-1]);
        auVar43 = vunpcklps_avx(*pauVar30,pauVar30[1]);
        auVar58 = vunpckhps_avx(*pauVar30,pauVar30[1]);
        auVar62 = vunpcklps_avx(pauVar30[2],pauVar30[3]);
        auVar60 = vunpckhps_avx(pauVar30[2],pauVar30[3]);
        auVar63 = vunpcklpd_avx(auVar42,auVar65);
        auVar42 = vunpckhpd_avx(auVar42,auVar65);
        auVar65 = vunpcklpd_avx(auVar53,auVar56);
        auVar53 = vunpckhpd_avx(auVar53,auVar56);
        auVar67 = vunpcklpd_avx(auVar43,auVar62);
        auVar56 = vunpckhpd_avx(auVar43,auVar62);
        auVar43 = vunpcklpd_avx(auVar58,auVar60);
        auVar58 = vunpckhpd_avx(auVar58,auVar60);
        auVar62._16_16_ = auVar67._0_16_;
        auVar62._0_16_ = auVar63._0_16_;
        auVar69._16_16_ = auVar56._0_16_;
        auVar69._0_16_ = auVar42._0_16_;
        auVar70._16_16_ = auVar43._0_16_;
        auVar70._0_16_ = auVar65._0_16_;
        auVar71._16_16_ = auVar58._0_16_;
        auVar71._0_16_ = auVar53._0_16_;
        auVar60 = vperm2f128_avx(auVar63,auVar67,0x31);
        auVar42 = vperm2f128_avx(auVar42,auVar56,0x31);
        auVar56 = vperm2f128_avx(auVar65,auVar43,0x31);
        auVar53 = vperm2f128_avx(auVar53,auVar58,0x31);
        *(undefined1 (*) [32])ppp_Var14 = auVar62;
        *(undefined1 (*) [32])(ppp_Var14 + 4) = auVar69;
        *(undefined1 (*) [32])(ppp_Var14 + 8) = auVar70;
        *(undefined1 (*) [32])(ppp_Var14 + 0xc) = auVar71;
        *(undefined1 (*) [32])(ppp_Var14 + 0x10) = auVar60;
        *(undefined1 (*) [32])(ppp_Var14 + 0x14) = auVar42;
        *(undefined1 (*) [32])(ppp_Var14 + 0x18) = auVar56;
        *(undefined1 (*) [32])(ppp_Var14 + 0x1c) = auVar53;
        ppp_Var14 = ppp_Var14 + 0x20;
        pauVar30 = (undefined1 (*) [32])(*pauVar30 + lVar22);
      }
    }
    lVar17 = lVar17 + 0x100;
  }
  uVar16 = uVar21 & 0xfffffffffffffff8;
  lVar17 = uVar16 << 5;
  for (; (long)uVar16 < (long)uVar21; uVar16 = uVar16 + 1) {
    uVar18 = (ulong)(uint)((int)uVar16 >> 0x1f) << 0x20 | uVar16 & 0xffffffff;
    ppp_Var14 = (_func_int ***)
                ((long)(_func_int ***)local_c8._0_8_ +
                (long)((int)((long)uVar18 % 8) + (int)((long)uVar18 / 8)) * local_88 *
                local_c8._16_8_);
    for (uVar18 = 0; uVar18 != uVar25; uVar18 = uVar18 + 1) {
      pauVar30 = (undefined1 (*) [32])
                 ((long)bottom_im2col->data +
                 bottom_im2col->cstep * bottom_im2col->elemsize * uVar18 + lVar17);
      iVar19 = iVar20;
      while (bVar37 = iVar19 != 0, iVar19 = iVar19 + -1, bVar37) {
        *(undefined1 (*) [32])ppp_Var14 = *pauVar30;
        ppp_Var14 = ppp_Var14 + 4;
        pauVar30 = (undefined1 (*) [32])(*pauVar30 + lVar22);
      }
    }
    lVar17 = lVar17 + 0x20;
  }
  uVar16 = (long)iVar4 / 8;
  uVar36 = uVar36 * iVar13;
  local_70 = (ulong)uVar36;
  uVar18 = 0;
  uVar25 = (ulong)(uVar36 * 8);
  if ((int)(uVar36 * 8) < 1) {
    uVar25 = uVar18;
  }
  iVar13 = (int)uVar16;
  local_60 = 0;
  if (0 < iVar13) {
    local_60 = uVar16 & 0xffffffff;
  }
  for (; uVar18 != local_60; uVar18 = uVar18 + 1) {
    sVar6 = top_blob->cstep;
    pvVar7 = top_blob->data;
    sVar8 = top_blob->elemsize;
    local_f0 = (undefined1 (*) [32])(uVar18 * 8 * sVar6 * sVar8 + (long)pvVar7);
    pauVar27 = (undefined1 (*) [32])((uVar18 * 8 + 1) * sVar6 * sVar8 + (long)pvVar7);
    pauVar29 = (undefined1 (*) [32])((uVar18 * 8 + 2) * sVar6 * sVar8 + (long)pvVar7);
    pauVar31 = (undefined1 (*) [32])((uVar18 * 8 + 3) * sVar6 * sVar8 + (long)pvVar7);
    pauVar34 = (undefined1 (*) [32])((uVar18 * 8 + 4) * sVar6 * sVar8 + (long)pvVar7);
    pauVar24 = (undefined1 (*) [32])((uVar18 * 8 + 5) * sVar6 * sVar8 + (long)pvVar7);
    pauVar15 = (undefined1 (*) [32])((uVar18 * 8 + 6) * sVar6 * sVar8 + (long)pvVar7);
    pauVar23 = (undefined1 (*) [32])((uVar18 * 8 + 7) * sVar6 * sVar8 + (long)pvVar7);
    zeros[0] = 0.0;
    zeros[1] = 0.0;
    zeros[2] = 0.0;
    zeros[3] = 0.0;
    zeros[4] = 0.0;
    zeros[5] = 0.0;
    zeros[6] = 0.0;
    zeros[7] = 0.0;
    pauVar30 = (undefined1 (*) [32])(uVar18 * 0x20 + (long)pvVar5);
    if (pvVar5 == (void *)0x0) {
      pauVar30 = (undefined1 (*) [32])zeros;
    }
    lVar17 = 0;
    for (uVar16 = 0; (long)(uVar16 | 7) < (long)uVar21; uVar16 = uVar16 + 8) {
      uVar2 = *(undefined4 *)*pauVar30;
      auVar42._4_4_ = uVar2;
      auVar42._0_4_ = uVar2;
      auVar42._8_4_ = uVar2;
      auVar42._12_4_ = uVar2;
      auVar42._16_4_ = uVar2;
      auVar42._20_4_ = uVar2;
      auVar42._24_4_ = uVar2;
      auVar42._28_4_ = uVar2;
      uVar2 = *(undefined4 *)(*pauVar30 + 4);
      auVar53._4_4_ = uVar2;
      auVar53._0_4_ = uVar2;
      auVar53._8_4_ = uVar2;
      auVar53._12_4_ = uVar2;
      auVar53._16_4_ = uVar2;
      auVar53._20_4_ = uVar2;
      auVar53._24_4_ = uVar2;
      auVar53._28_4_ = uVar2;
      uVar2 = *(undefined4 *)(*pauVar30 + 8);
      auVar56._4_4_ = uVar2;
      auVar56._0_4_ = uVar2;
      auVar56._8_4_ = uVar2;
      auVar56._12_4_ = uVar2;
      auVar56._16_4_ = uVar2;
      auVar56._20_4_ = uVar2;
      auVar56._24_4_ = uVar2;
      auVar56._28_4_ = uVar2;
      uVar2 = *(undefined4 *)(*pauVar30 + 0xc);
      auVar58._4_4_ = uVar2;
      auVar58._0_4_ = uVar2;
      auVar58._8_4_ = uVar2;
      auVar58._12_4_ = uVar2;
      auVar58._16_4_ = uVar2;
      auVar58._20_4_ = uVar2;
      auVar58._24_4_ = uVar2;
      auVar58._28_4_ = uVar2;
      uVar2 = *(undefined4 *)(*pauVar30 + 0x10);
      auVar60._4_4_ = uVar2;
      auVar60._0_4_ = uVar2;
      auVar60._8_4_ = uVar2;
      auVar60._12_4_ = uVar2;
      auVar60._16_4_ = uVar2;
      auVar60._20_4_ = uVar2;
      auVar60._24_4_ = uVar2;
      auVar60._28_4_ = uVar2;
      uVar2 = *(undefined4 *)(*pauVar30 + 0x14);
      auVar63._4_4_ = uVar2;
      auVar63._0_4_ = uVar2;
      auVar63._8_4_ = uVar2;
      auVar63._12_4_ = uVar2;
      auVar63._16_4_ = uVar2;
      auVar63._20_4_ = uVar2;
      auVar63._24_4_ = uVar2;
      auVar63._28_4_ = uVar2;
      uVar2 = *(undefined4 *)(*pauVar30 + 0x18);
      auVar65._4_4_ = uVar2;
      auVar65._0_4_ = uVar2;
      auVar65._8_4_ = uVar2;
      auVar65._12_4_ = uVar2;
      auVar65._16_4_ = uVar2;
      auVar65._20_4_ = uVar2;
      auVar65._24_4_ = uVar2;
      auVar65._28_4_ = uVar2;
      uVar2 = *(undefined4 *)(*pauVar30 + 0x1c);
      auVar67._4_4_ = uVar2;
      auVar67._0_4_ = uVar2;
      auVar67._8_4_ = uVar2;
      auVar67._12_4_ = uVar2;
      auVar67._16_4_ = uVar2;
      auVar67._20_4_ = uVar2;
      auVar67._24_4_ = uVar2;
      auVar67._28_4_ = uVar2;
      lVar22 = kernel->cstep * uVar18 * kernel->elemsize;
      pvVar7 = kernel->data;
      lVar33 = 0;
      uVar28 = uVar25;
      while (iVar20 = (int)uVar28, uVar28 = (ulong)(iVar20 - 1), iVar20 != 0) {
        fVar47 = *(float *)((long)pvVar7 + lVar33 + lVar22);
        pfVar26 = (float *)((long)(_func_int ***)local_c8._0_8_ +
                           lVar33 + local_88 * local_c8._16_8_ * lVar17);
        fVar46 = *pfVar26;
        fVar49 = pfVar26[1];
        fVar50 = pfVar26[2];
        fVar51 = pfVar26[3];
        fVar52 = pfVar26[4];
        fVar10 = pfVar26[5];
        fVar11 = pfVar26[6];
        fVar48 = *(float *)((long)pvVar7 + lVar33 + lVar22 + 4);
        auVar43._0_4_ = fVar47 * fVar46 + auVar42._0_4_;
        auVar43._4_4_ = fVar47 * fVar49 + auVar42._4_4_;
        auVar43._8_4_ = fVar47 * fVar50 + auVar42._8_4_;
        auVar43._12_4_ = fVar47 * fVar51 + auVar42._12_4_;
        auVar43._16_4_ = fVar47 * fVar52 + auVar42._16_4_;
        auVar43._20_4_ = fVar47 * fVar10 + auVar42._20_4_;
        auVar43._24_4_ = fVar47 * fVar11 + auVar42._24_4_;
        auVar43._28_4_ = fVar47 + auVar42._28_4_;
        fVar39 = *(float *)((long)pvVar7 + lVar33 + lVar22 + 8);
        auVar54._0_4_ = fVar48 * fVar46 + auVar53._0_4_;
        auVar54._4_4_ = fVar48 * fVar49 + auVar53._4_4_;
        auVar54._8_4_ = fVar48 * fVar50 + auVar53._8_4_;
        auVar54._12_4_ = fVar48 * fVar51 + auVar53._12_4_;
        auVar54._16_4_ = fVar48 * fVar52 + auVar53._16_4_;
        auVar54._20_4_ = fVar48 * fVar10 + auVar53._20_4_;
        auVar54._24_4_ = fVar48 * fVar11 + auVar53._24_4_;
        auVar54._28_4_ = fVar47 + auVar53._28_4_;
        fVar47 = *(float *)((long)pvVar7 + lVar33 + lVar22 + 0xc);
        auVar57._0_4_ = fVar39 * fVar46 + auVar56._0_4_;
        auVar57._4_4_ = fVar39 * fVar49 + auVar56._4_4_;
        auVar57._8_4_ = fVar39 * fVar50 + auVar56._8_4_;
        auVar57._12_4_ = fVar39 * fVar51 + auVar56._12_4_;
        auVar57._16_4_ = fVar39 * fVar52 + auVar56._16_4_;
        auVar57._20_4_ = fVar39 * fVar10 + auVar56._20_4_;
        auVar57._24_4_ = fVar39 * fVar11 + auVar56._24_4_;
        auVar57._28_4_ = fVar39 + auVar56._28_4_;
        fVar48 = *(float *)((long)pvVar7 + lVar33 + lVar22 + 0x10);
        auVar59._0_4_ = fVar47 * fVar46 + auVar58._0_4_;
        auVar59._4_4_ = fVar47 * fVar49 + auVar58._4_4_;
        auVar59._8_4_ = fVar47 * fVar50 + auVar58._8_4_;
        auVar59._12_4_ = fVar47 * fVar51 + auVar58._12_4_;
        auVar59._16_4_ = fVar47 * fVar52 + auVar58._16_4_;
        auVar59._20_4_ = fVar47 * fVar10 + auVar58._20_4_;
        auVar59._24_4_ = fVar47 * fVar11 + auVar58._24_4_;
        auVar59._28_4_ = fVar47 + auVar58._28_4_;
        fVar47 = *(float *)((long)pvVar7 + lVar33 + lVar22 + 0x14);
        auVar61._0_4_ = fVar48 * fVar46 + auVar60._0_4_;
        auVar61._4_4_ = fVar48 * fVar49 + auVar60._4_4_;
        auVar61._8_4_ = fVar48 * fVar50 + auVar60._8_4_;
        auVar61._12_4_ = fVar48 * fVar51 + auVar60._12_4_;
        auVar61._16_4_ = fVar48 * fVar52 + auVar60._16_4_;
        auVar61._20_4_ = fVar48 * fVar10 + auVar60._20_4_;
        auVar61._24_4_ = fVar48 * fVar11 + auVar60._24_4_;
        auVar61._28_4_ = fVar48 + auVar60._28_4_;
        fVar48 = *(float *)((long)pvVar7 + lVar33 + lVar22 + 0x18);
        auVar64._0_4_ = fVar47 * fVar46 + auVar63._0_4_;
        auVar64._4_4_ = fVar47 * fVar49 + auVar63._4_4_;
        auVar64._8_4_ = fVar47 * fVar50 + auVar63._8_4_;
        auVar64._12_4_ = fVar47 * fVar51 + auVar63._12_4_;
        auVar64._16_4_ = fVar47 * fVar52 + auVar63._16_4_;
        auVar64._20_4_ = fVar47 * fVar10 + auVar63._20_4_;
        auVar64._24_4_ = fVar47 * fVar11 + auVar63._24_4_;
        auVar64._28_4_ = fVar47 + auVar63._28_4_;
        fVar47 = *(float *)((long)pvVar7 + lVar33 + lVar22 + 0x1c);
        auVar66._0_4_ = fVar48 * fVar46 + auVar65._0_4_;
        auVar66._4_4_ = fVar48 * fVar49 + auVar65._4_4_;
        auVar66._8_4_ = fVar48 * fVar50 + auVar65._8_4_;
        auVar66._12_4_ = fVar48 * fVar51 + auVar65._12_4_;
        auVar66._16_4_ = fVar48 * fVar52 + auVar65._16_4_;
        auVar66._20_4_ = fVar48 * fVar10 + auVar65._20_4_;
        auVar66._24_4_ = fVar48 * fVar11 + auVar65._24_4_;
        auVar66._28_4_ = fVar48 + auVar65._28_4_;
        auVar68._0_4_ = fVar47 * fVar46 + auVar67._0_4_;
        auVar68._4_4_ = fVar47 * fVar49 + auVar67._4_4_;
        auVar68._8_4_ = fVar47 * fVar50 + auVar67._8_4_;
        auVar68._12_4_ = fVar47 * fVar51 + auVar67._12_4_;
        auVar68._16_4_ = fVar47 * fVar52 + auVar67._16_4_;
        auVar68._20_4_ = fVar47 * fVar10 + auVar67._20_4_;
        auVar68._24_4_ = fVar47 * fVar11 + auVar67._24_4_;
        auVar68._28_4_ = fVar47 + auVar67._28_4_;
        lVar33 = lVar33 + 0x20;
        auVar42 = auVar43;
        auVar53 = auVar54;
        auVar56 = auVar57;
        auVar58 = auVar59;
        auVar60 = auVar61;
        auVar63 = auVar64;
        auVar65 = auVar66;
        auVar67 = auVar68;
      }
      *local_f0 = auVar42;
      *pauVar27 = auVar53;
      *pauVar29 = auVar56;
      *pauVar31 = auVar58;
      *pauVar34 = auVar60;
      *pauVar24 = auVar63;
      *pauVar15 = auVar65;
      *pauVar23 = auVar67;
      local_f0 = local_f0 + 1;
      pauVar27 = pauVar27 + 1;
      pauVar29 = pauVar29 + 1;
      pauVar31 = pauVar31 + 1;
      pauVar34 = pauVar34 + 1;
      pauVar24 = pauVar24 + 1;
      pauVar15 = pauVar15 + 1;
      pauVar23 = pauVar23 + 1;
      lVar17 = lVar17 + 1;
    }
    sVar6 = kernel->cstep;
    sVar8 = kernel->elemsize;
    pvVar7 = kernel->data;
    while (uVar35 = (uint)uVar16, (int)uVar35 < (int)uVar3) {
      lVar17 = 0;
      pfVar26 = (float *)(sVar6 * uVar18 * sVar8 + (long)pvVar7);
      auVar42 = *pauVar30;
      while( true ) {
        if ((int)uVar25 == (int)lVar17) break;
        fVar47 = *(float *)((long)(_func_int ***)local_c8._0_8_ +
                           lVar17 * 4 +
                           (ulong)((uVar35 & 7) + ((uint)(uVar16 >> 3) & 0x1fffffff)) *
                           local_88 * local_c8._16_8_);
        auVar44._0_4_ = fVar47 * *pfVar26 + auVar42._0_4_;
        auVar44._4_4_ = fVar47 * pfVar26[1] + auVar42._4_4_;
        auVar44._8_4_ = fVar47 * pfVar26[2] + auVar42._8_4_;
        auVar44._12_4_ = fVar47 * pfVar26[3] + auVar42._12_4_;
        auVar44._16_4_ = fVar47 * pfVar26[4] + auVar42._16_4_;
        auVar44._20_4_ = fVar47 * pfVar26[5] + auVar42._20_4_;
        auVar44._24_4_ = fVar47 * pfVar26[6] + auVar42._24_4_;
        auVar44._28_4_ = fVar47 + auVar42._28_4_;
        pfVar26 = pfVar26 + 8;
        lVar17 = lVar17 + 1;
        auVar42 = auVar44;
      }
      *(float *)*local_f0 = auVar42._0_4_;
      auVar38 = auVar42._0_16_;
      uVar2 = vextractps_avx(auVar38,1);
      *(undefined4 *)*pauVar27 = uVar2;
      uVar2 = vextractps_avx(auVar38,2);
      *(undefined4 *)*pauVar29 = uVar2;
      uVar2 = vextractps_avx(auVar38,3);
      *(undefined4 *)*pauVar31 = uVar2;
      auVar38 = auVar42._16_16_;
      *(float *)*pauVar34 = auVar42._16_4_;
      uVar2 = vextractps_avx(auVar38,1);
      *(undefined4 *)*pauVar24 = uVar2;
      uVar2 = vextractps_avx(auVar38,2);
      *(undefined4 *)*pauVar15 = uVar2;
      uVar2 = vextractps_avx(auVar38,3);
      *(undefined4 *)*pauVar23 = uVar2;
      local_f0 = (undefined1 (*) [32])((long)*local_f0 + 4);
      pauVar27 = (undefined1 (*) [32])((long)*pauVar27 + 4);
      pauVar29 = (undefined1 (*) [32])((long)*pauVar29 + 4);
      pauVar31 = (undefined1 (*) [32])((long)*pauVar31 + 4);
      pauVar34 = (undefined1 (*) [32])((long)*pauVar34 + 4);
      pauVar24 = (undefined1 (*) [32])((long)*pauVar24 + 4);
      pauVar15 = (undefined1 (*) [32])((long)*pauVar15 + 4);
      pauVar23 = (undefined1 (*) [32])((long)*pauVar23 + 4);
      uVar16 = (ulong)(uVar35 + 1);
    }
  }
  uVar16 = local_70;
  if ((int)uVar36 < 1) {
    uVar16 = 0;
  }
  for (uVar18 = (ulong)(iVar13 << 3); (long)uVar18 < (long)iVar4; uVar18 = uVar18 + 1) {
    if (pvVar5 == (void *)0x0) {
      auVar38 = ZEXT816(0) << 0x40;
    }
    else {
      auVar38 = ZEXT416(*(uint *)((long)pvVar5 + uVar18 * 4));
    }
    pauVar30 = (undefined1 (*) [32])
               (top_blob->cstep * uVar18 * top_blob->elemsize + (long)top_blob->data);
    uVar28 = (ulong)(uint)((int)uVar18 >> 0x1f) << 0x20 | uVar18 & 0xffffffff;
    lVar17 = (long)((int)((long)uVar28 % 8) + (int)((long)uVar28 / 8));
    auVar9 = vshufps_avx(auVar38,auVar38,0);
    auVar45._16_16_ = auVar9;
    auVar45._0_16_ = auVar9;
    for (uVar28 = 0; (long)(uVar28 | 7) < (long)uVar21; uVar28 = uVar28 + 8) {
      ppp_Var14 = (_func_int ***)
                  ((long)(_func_int ***)local_c8._0_8_ + local_88 * (uVar28 >> 3) * local_c8._16_8_)
      ;
      auVar42 = auVar45;
      for (lVar22 = 0; (int)uVar25 != (int)lVar22; lVar22 = lVar22 + 1) {
        fVar47 = *(float *)((long)kernel->data +
                           lVar22 * 4 + kernel->cstep * lVar17 * kernel->elemsize);
        auVar55._0_4_ = fVar47 * *(float *)ppp_Var14 + auVar42._0_4_;
        auVar55._4_4_ = fVar47 * *(float *)((long)ppp_Var14 + 4) + auVar42._4_4_;
        auVar55._8_4_ = fVar47 * *(float *)(ppp_Var14 + 1) + auVar42._8_4_;
        auVar55._12_4_ = fVar47 * *(float *)((long)(ppp_Var14 + 1) + 4) + auVar42._12_4_;
        auVar55._16_4_ = fVar47 * *(float *)(ppp_Var14 + 2) + auVar42._16_4_;
        auVar55._20_4_ = fVar47 * *(float *)((long)(ppp_Var14 + 2) + 4) + auVar42._20_4_;
        auVar55._24_4_ = fVar47 * *(float *)(ppp_Var14 + 3) + auVar42._24_4_;
        auVar55._28_4_ = fVar47 + auVar42._28_4_;
        ppp_Var14 = ppp_Var14 + 4;
        auVar42 = auVar55;
      }
      *pauVar30 = auVar42;
      pauVar30 = pauVar30 + 1;
    }
    sVar6 = kernel->cstep;
    sVar8 = kernel->elemsize;
    pvVar7 = kernel->data;
    while (uVar36 = (uint)uVar28, (int)uVar36 < (int)uVar3) {
      fVar47 = 0.0;
      fVar48 = 0.0;
      fVar39 = 0.0;
      fVar46 = 0.0;
      fVar49 = 0.0;
      fVar50 = 0.0;
      fVar51 = 0.0;
      fVar52 = 0.0;
      lVar22 = 0;
      uVar32 = uVar16;
      while (iVar13 = (int)uVar32, uVar32 = (ulong)(iVar13 - 1), iVar13 != 0) {
        pfVar26 = (float *)((long)pvVar7 + lVar22 + lVar17 * sVar6 * sVar8);
        pfVar1 = (float *)((long)(_func_int ***)local_c8._0_8_ +
                          lVar22 + (ulong)((uVar36 & 7) + ((uint)(uVar28 >> 3) & 0x1fffffff)) *
                                   local_88 * local_c8._16_8_);
        fVar39 = *pfVar26 * *pfVar1 + fVar39;
        fVar46 = pfVar26[1] * pfVar1[1] + fVar46;
        fVar47 = pfVar26[2] * pfVar1[2] + fVar47;
        fVar48 = pfVar26[3] * pfVar1[3] + fVar48;
        fVar49 = pfVar26[4] * pfVar1[4] + fVar49;
        fVar50 = pfVar26[5] * pfVar1[5] + fVar50;
        fVar51 = pfVar26[6] * pfVar1[6] + fVar51;
        fVar52 = pfVar26[7] + fVar52;
        lVar22 = lVar22 + 0x20;
      }
      auVar40._0_4_ = fVar49 + fVar39;
      auVar40._4_4_ = fVar50 + fVar46;
      auVar40._8_4_ = fVar51 + fVar47;
      auVar40._12_4_ = fVar52 + fVar48;
      auVar9 = vshufpd_avx(auVar40,auVar40,1);
      auVar41._0_4_ = auVar9._0_4_ + auVar40._0_4_;
      auVar41._4_4_ = auVar9._4_4_ + auVar40._4_4_;
      auVar41._8_4_ = auVar9._8_4_ + auVar40._8_4_;
      auVar41._12_4_ = auVar9._12_4_ + auVar40._12_4_;
      auVar9 = vmovshdup_avx(auVar41);
      *(float *)*pauVar30 = auVar9._0_4_ + auVar38._0_4_ + auVar41._0_4_;
      pauVar30 = (undefined1 (*) [32])(*pauVar30 + 4);
      uVar28 = (ulong)(uVar36 + 1);
    }
  }
  piVar12 = (int *)CONCAT44(local_c8._12_4_,local_c8._8_4_);
  if (piVar12 != (int *)0x0) {
    LOCK();
    *piVar12 = *piVar12 + -1;
    UNLOCK();
    if (*piVar12 == 0) {
      local_78 = pvVar5;
      local_68 = top_blob;
      if ((Allocator *)local_c8._32_8_ == (Allocator *)0x0) {
        free((void *)local_c8._0_8_);
      }
      else {
        (*(*(_func_int ***)local_c8._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

static void im2col_sgemm_pack8to1_avx(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    // Mat bottom_im2col(size, maxk, inch, 4u * 8, 8, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    const float* bias = _bias;

    Mat tmp;
    if (size >= 8)
        tmp.create(8 * maxk, inch, size / 8 + size % 8, 4u * 8, 8, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 4u * 8, 8, opt.workspace_allocator);
    {
        int remain_size_start = 0;
        int nn_size = size >> 3;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = ii * 8;

            float* tmpptr = tmp.channel(i / 8);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 8;

                for (int k = 0; k < maxk; k++)
                {
                    // transpose 8x8
                    __m256 _r0 = _mm256_load_ps(img0);
                    __m256 _r1 = _mm256_load_ps(img0 + 8);
                    __m256 _r2 = _mm256_load_ps(img0 + 8 * 2);
                    __m256 _r3 = _mm256_load_ps(img0 + 8 * 3);
                    __m256 _r4 = _mm256_load_ps(img0 + 8 * 4);
                    __m256 _r5 = _mm256_load_ps(img0 + 8 * 5);
                    __m256 _r6 = _mm256_load_ps(img0 + 8 * 6);
                    __m256 _r7 = _mm256_load_ps(img0 + 8 * 7);

                    __m256 _tmp0 = _mm256_unpacklo_ps(_r0, _r1);
                    __m256 _tmp1 = _mm256_unpackhi_ps(_r0, _r1);
                    __m256 _tmp2 = _mm256_unpacklo_ps(_r2, _r3);
                    __m256 _tmp3 = _mm256_unpackhi_ps(_r2, _r3);
                    __m256 _tmp4 = _mm256_unpacklo_ps(_r4, _r5);
                    __m256 _tmp5 = _mm256_unpackhi_ps(_r4, _r5);
                    __m256 _tmp6 = _mm256_unpacklo_ps(_r6, _r7);
                    __m256 _tmp7 = _mm256_unpackhi_ps(_r6, _r7);
                    __m256 _tmp8 = _mm256_shuffle_ps(_tmp0, _tmp2, _MM_SHUFFLE(1, 0, 1, 0));
                    __m256 _tmp9 = _mm256_shuffle_ps(_tmp0, _tmp2, _MM_SHUFFLE(3, 2, 3, 2));
                    __m256 _tmpa = _mm256_shuffle_ps(_tmp1, _tmp3, _MM_SHUFFLE(1, 0, 1, 0));
                    __m256 _tmpb = _mm256_shuffle_ps(_tmp1, _tmp3, _MM_SHUFFLE(3, 2, 3, 2));
                    __m256 _tmpc = _mm256_shuffle_ps(_tmp4, _tmp6, _MM_SHUFFLE(1, 0, 1, 0));
                    __m256 _tmpd = _mm256_shuffle_ps(_tmp4, _tmp6, _MM_SHUFFLE(3, 2, 3, 2));
                    __m256 _tmpe = _mm256_shuffle_ps(_tmp5, _tmp7, _MM_SHUFFLE(1, 0, 1, 0));
                    __m256 _tmpf = _mm256_shuffle_ps(_tmp5, _tmp7, _MM_SHUFFLE(3, 2, 3, 2));
                    _r0 = _mm256_permute2f128_ps(_tmp8, _tmpc, _MM_SHUFFLE(0, 2, 0, 0));
                    _r1 = _mm256_permute2f128_ps(_tmp9, _tmpd, _MM_SHUFFLE(0, 2, 0, 0));
                    _r2 = _mm256_permute2f128_ps(_tmpa, _tmpe, _MM_SHUFFLE(0, 2, 0, 0));
                    _r3 = _mm256_permute2f128_ps(_tmpb, _tmpf, _MM_SHUFFLE(0, 2, 0, 0));
                    _r4 = _mm256_permute2f128_ps(_tmp8, _tmpc, _MM_SHUFFLE(0, 3, 0, 1));
                    _r5 = _mm256_permute2f128_ps(_tmp9, _tmpd, _MM_SHUFFLE(0, 3, 0, 1));
                    _r6 = _mm256_permute2f128_ps(_tmpa, _tmpe, _MM_SHUFFLE(0, 3, 0, 1));
                    _r7 = _mm256_permute2f128_ps(_tmpb, _tmpf, _MM_SHUFFLE(0, 3, 0, 1));

                    _mm256_store_ps(tmpptr, _r0);
                    _mm256_store_ps(tmpptr + 8, _r1);
                    _mm256_store_ps(tmpptr + 8 * 2, _r2);
                    _mm256_store_ps(tmpptr + 8 * 3, _r3);
                    _mm256_store_ps(tmpptr + 8 * 4, _r4);
                    _mm256_store_ps(tmpptr + 8 * 5, _r5);
                    _mm256_store_ps(tmpptr + 8 * 6, _r6);
                    _mm256_store_ps(tmpptr + 8 * 7, _r7);

                    img0 += size * 8;
                    tmpptr += 64;
                }
            }
        }

        remain_size_start += nn_size << 3;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 8 + i % 8);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 8;

                for (int k = 0; k < maxk; k++)
                {
                    __m256 _val = _mm256_load_ps(img0);
                    _mm256_store_ps(tmpptr, _val);

                    img0 += size * 8;
                    tmpptr += 8;
                }
            }
        }
    }

    int nn_outch = outch / 8;
    int remain_outch_start = nn_outch * 8;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int pp = 0; pp < nn_outch; pp++)
    {
        int p = pp * 8;

        float* outptr0 = top_blob.channel(p);
        float* outptr1 = top_blob.channel(p + 1);
        float* outptr2 = top_blob.channel(p + 2);
        float* outptr3 = top_blob.channel(p + 3);
        float* outptr4 = top_blob.channel(p + 4);
        float* outptr5 = top_blob.channel(p + 5);
        float* outptr6 = top_blob.channel(p + 6);
        float* outptr7 = top_blob.channel(p + 7);

        const float zeros[8] = {0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f};
        const float* biasptr = bias ? bias + p : zeros;

        int i = 0;
        for (; i + 7 < size; i += 8)
        {
            const float* tmpptr = tmp.channel(i / 8);
            const float* kptr0 = kernel.channel(p / 8);

            int nn = inch * maxk * 8; // inch always > 0

            __m256 _sum0 = _mm256_broadcast_ss(biasptr);
            __m256 _sum1 = _mm256_broadcast_ss(biasptr + 1);
            __m256 _sum2 = _mm256_broadcast_ss(biasptr + 2);
            __m256 _sum3 = _mm256_broadcast_ss(biasptr + 3);
            __m256 _sum4 = _mm256_broadcast_ss(biasptr + 4);
            __m256 _sum5 = _mm256_broadcast_ss(biasptr + 5);
            __m256 _sum6 = _mm256_broadcast_ss(biasptr + 6);
            __m256 _sum7 = _mm256_broadcast_ss(biasptr + 7);

            for (int j = 0; j < nn; j++)
            {
                __m256 _val0 = _mm256_load_ps(tmpptr);

                __m256 _w0 = _mm256_broadcast_ss(kptr0);
                __m256 _w1 = _mm256_broadcast_ss(kptr0 + 1);
                _sum0 = _mm256_comp_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_val0, _w1, _sum1);
                __m256 _w2 = _mm256_broadcast_ss(kptr0 + 2);
                __m256 _w3 = _mm256_broadcast_ss(kptr0 + 3);
                _sum2 = _mm256_comp_fmadd_ps(_val0, _w2, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_val0, _w3, _sum3);
                __m256 _w4 = _mm256_broadcast_ss(kptr0 + 4);
                __m256 _w5 = _mm256_broadcast_ss(kptr0 + 5);
                _sum4 = _mm256_comp_fmadd_ps(_val0, _w4, _sum4);
                _sum5 = _mm256_comp_fmadd_ps(_val0, _w5, _sum5);
                __m256 _w6 = _mm256_broadcast_ss(kptr0 + 6);
                __m256 _w7 = _mm256_broadcast_ss(kptr0 + 7);
                _sum6 = _mm256_comp_fmadd_ps(_val0, _w6, _sum6);
                _sum7 = _mm256_comp_fmadd_ps(_val0, _w7, _sum7);

                tmpptr += 8;
                kptr0 += 8;
            }

            _mm256_storeu_ps(outptr0, _sum0);
            _mm256_storeu_ps(outptr1, _sum1);
            _mm256_storeu_ps(outptr2, _sum2);
            _mm256_storeu_ps(outptr3, _sum3);
            _mm256_storeu_ps(outptr4, _sum4);
            _mm256_storeu_ps(outptr5, _sum5);
            _mm256_storeu_ps(outptr6, _sum6);
            _mm256_storeu_ps(outptr7, _sum7);

            outptr0 += 8;
            outptr1 += 8;
            outptr2 += 8;
            outptr3 += 8;
            outptr4 += 8;
            outptr5 += 8;
            outptr6 += 8;
            outptr7 += 8;
        }
        for (; i < size; i++)
        {
            const float* tmpptr = tmp.channel(i / 8 + i % 8);
            const float* kptr0 = kernel.channel(p / 8);

            int nn = inch * maxk * 8; // inch always > 0

            __m256 _sum = _mm256_loadu_ps(biasptr);

            for (int j = 0; j < nn; j++)
            {
                __m256 _val0 = _mm256_broadcast_ss(tmpptr);
                __m256 _w0 = _mm256_load_ps(kptr0);
                _sum = _mm256_comp_fmadd_ps(_val0, _w0, _sum);

                tmpptr += 1;
                kptr0 += 8;
            }

            float sum[8];
            _mm256_storeu_ps(sum, _sum);

            outptr0[0] = sum[0];
            outptr1[0] = sum[1];
            outptr2[0] = sum[2];
            outptr3[0] = sum[3];
            outptr4[0] = sum[4];
            outptr5[0] = sum[5];
            outptr6[0] = sum[6];
            outptr7[0] = sum[7];

            outptr0 += 1;
            outptr1 += 1;
            outptr2 += 1;
            outptr3 += 1;
            outptr4 += 1;
            outptr5 += 1;
            outptr6 += 1;
            outptr7 += 1;
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = remain_outch_start; p < outch; p++)
    {
        float* outptr0 = top_blob.channel(p);

        const float bias0 = bias ? bias[p] : 0.f;

        int i = 0;
        for (; i + 7 < size; i += 8)
        {
            const float* tmpptr = tmp.channel(i / 8);
            const float* kptr0 = kernel.channel(p / 8 + p % 8);

            int nn = inch * maxk * 8; // inch always > 0

            __m256 _sum0 = _mm256_set1_ps(bias0);

            for (int j = 0; j < nn; j++)
            {
                __m256 _val0 = _mm256_load_ps(tmpptr);
                __m256 _w0 = _mm256_broadcast_ss(kptr0);
                _sum0 = _mm256_comp_fmadd_ps(_w0, _val0, _sum0);

                tmpptr += 8;
                kptr0 += 1;
            }

            _mm256_storeu_ps(outptr0, _sum0);
            outptr0 += 8;
        }
        for (; i < size; i++)
        {
            const float* tmpptr = tmp.channel(i / 8 + i % 8);
            const float* kptr0 = kernel.channel(p / 8 + p % 8);

            int nn = inch * maxk; // inch always > 0

            float sum0 = bias0;

            __m256 _sum0 = _mm256_setzero_ps();

            for (int j = 0; j < nn; j++)
            {
                __m256 _val0 = _mm256_load_ps(tmpptr);
                __m256 _w0 = _mm256_load_ps(kptr0);
                _sum0 = _mm256_comp_fmadd_ps(_val0, _w0, _sum0);

                tmpptr += 8;
                kptr0 += 8;
            }

            sum0 += _mm256_reduce_add_ps(_sum0);

            outptr0[0] = sum0;
            outptr0 += 1;
        }
    }
}